

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerMSL::emit_struct_member
          (CompilerMSL *this,SPIRType *type,uint32_t member_type_id,uint32_t index,string *qualifier
          ,uint32_t param_5)

{
  bool bVar1;
  BuiltIn builtin;
  uint32_t index_local;
  uint32_t pad_len;
  
  index_local = index;
  bVar1 = Compiler::has_extended_member_decoration
                    ((Compiler *)this,(type->super_IVariant).self.id,index,
                     SPIRVCrossDecorationPaddingTarget);
  if (bVar1) {
    pad_len = Compiler::get_extended_member_decoration
                        ((Compiler *)this,(type->super_IVariant).self.id,index,
                         SPIRVCrossDecorationPaddingTarget);
    CompilerGLSL::
    statement<char_const(&)[8],unsigned_int&,char_const(&)[5],char_const(&)[2],unsigned_int&,char_const(&)[3]>
              (&this->super_CompilerGLSL,(char (*) [8])"char _m",&index_local,(char (*) [5])"_pad",
               (char (*) [2])0x2828da,&pad_len,(char (*) [3])0x281409);
  }
  builtin = BuiltInMax;
  bVar1 = is_mesh_shader(this);
  if ((((bVar1) &&
       (bVar1 = Compiler::is_member_builtin((Compiler *)this,type,index_local,&builtin), bVar1)) &&
      (bVar1 = Compiler::has_active_builtin((Compiler *)this,builtin,StorageClassOutput), !bVar1))
     && (bVar1 = Compiler::has_active_builtin((Compiler *)this,builtin,StorageClassInput), !bVar1))
  {
    return;
  }
  this->builtin_declaration = true;
  to_struct_member((string *)&pad_len,this,type,member_type_id,index_local,qualifier);
  CompilerGLSL::statement<std::__cxx11::string>(&this->super_CompilerGLSL,(string *)&pad_len);
  ::std::__cxx11::string::~string((string *)&pad_len);
  this->builtin_declaration = false;
  return;
}

Assistant:

void CompilerMSL::emit_struct_member(const SPIRType &type, uint32_t member_type_id, uint32_t index,
                                     const string &qualifier, uint32_t)
{
	// If this member requires padding to maintain its declared offset, emit a dummy padding member before it.
	if (has_extended_member_decoration(type.self, index, SPIRVCrossDecorationPaddingTarget))
	{
		uint32_t pad_len = get_extended_member_decoration(type.self, index, SPIRVCrossDecorationPaddingTarget);
		statement("char _m", index, "_pad", "[", pad_len, "];");
	}

	BuiltIn builtin = BuiltInMax;
	if (is_mesh_shader() && is_member_builtin(type, index, &builtin))
	{
		if (!has_active_builtin(builtin, StorageClassOutput) && !has_active_builtin(builtin, StorageClassInput))
		{
			// Do not emit unused builtins in mesh-output blocks
			return;
		}
	}

	// Handle HLSL-style 0-based vertex/instance index.
	builtin_declaration = true;
	statement(to_struct_member(type, member_type_id, index, qualifier));
	builtin_declaration = false;
}